

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

int __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::init
          (TransformFeedbackOverflowQueryFunctionalBase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  GLuint *pGVar4;
  ShaderProgram *this_00;
  NotSupportedError *this_01;
  TestError *this_02;
  ulong uVar5;
  allocator<char> local_132;
  allocator<char> local_131;
  string local_130;
  string local_110;
  ProgramSources local_f0;
  long lVar3;
  
  TransformFeedbackOverflowQueryBaseTest::init
            (&this->super_TransformFeedbackOverflowQueryBaseTest,ctx);
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  bVar1 = canTestOverflow(this);
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               "QUERY_COUNTER_BITS for TRANSFORM_FEEDBACK_OVERFLOW_ARB queries is zero, skipping test"
               ,(allocator<char> *)&local_130);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)&local_f0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar3 + 0x708))(1,&this->m_vao);
  (**(code **)(lVar3 + 0xd8))(this->m_vao);
  (**(code **)(lVar3 + 0x6e0))(1,&this->m_overflow_query);
  bVar1 = canTestStreamOverflow(this);
  if (bVar1) {
    uVar5 = (ulong)(this->super_TransformFeedbackOverflowQueryBaseTest).m_max_vertex_streams;
    pGVar4 = (GLuint *)operator_new__(uVar5 << 2);
    this->m_stream_overflow_query = pGVar4;
    (**(code **)(lVar3 + 0x6e0))(uVar5,pGVar4);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
              m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,
             "#version 150 core\nvoid main() {\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n}\n",
             &local_131);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"#version 150 core\nvoid main() {}\n",&local_132);
  glu::makeVtxFragSources(&local_f0,&local_130,&local_110);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_f0);
  this->m_checker_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  if ((this->m_checker_program->m_program).m_info.linkOk != false) {
    buildTransformFeedbackProgram(this);
    setupTransformFeedbackBuffers(this);
    return extraout_EAX;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Checker program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
             ,0x3f6);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

virtual void init()
	{
		TransformFeedbackOverflowQueryBaseTest::init();

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if (canTestOverflow())
		{
			// Setup vertex array
			gl.genVertexArrays(1, &m_vao);
			gl.bindVertexArray(m_vao);

			// Setup queries
			gl.genQueries(1, &m_overflow_query);

			if (canTestStreamOverflow())
			{
				m_stream_overflow_query = new GLuint[getMaxVertexStreams()];

				gl.genQueries(getMaxVertexStreams(), m_stream_overflow_query);
			}

			// Setup checker program
			m_checker_program =
				new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(dummyVsh(), dummyFsh()));
			if (!m_checker_program->isOk())
			{
				TCU_FAIL("Checker program compilation failed");
			}

			// Setup transform feedback shader and buffers
			buildTransformFeedbackProgram();
			setupTransformFeedbackBuffers();
		}
		else
		{
			throw tcu::NotSupportedError(
				"QUERY_COUNTER_BITS for TRANSFORM_FEEDBACK_OVERFLOW_ARB queries is zero, skipping test");
		}
	}